

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall p2t::Sweep::FinalizationPolygon(Sweep *this,SweepContext *tcx)

{
  Node *pNVar1;
  Point *p;
  bool bVar2;
  Triangle *this_00;
  
  pNVar1 = tcx->front_->head_->next;
  p = pNVar1->point;
  this_00 = pNVar1->triangle;
  while( true ) {
    bVar2 = Triangle::GetConstrainedEdgeCW(this_00,p);
    if (bVar2) break;
    this_00 = Triangle::NeighborCCW(this_00,p);
  }
  SweepContext::MeshClean(tcx,this_00);
  return;
}

Assistant:

void Sweep::FinalizationPolygon(SweepContext& tcx)
{
  // Get an Internal triangle to start with
  Triangle* t = tcx.front()->head()->next->triangle;
  Point* p = tcx.front()->head()->next->point;
  while (!t->GetConstrainedEdgeCW(*p)) {
    t = t->NeighborCCW(*p);
  }

  // Collect interior triangles constrained by edges
  tcx.MeshClean(*t);
}